

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::Scrollbar(ImGuiAxis axis)

{
  float fVar1;
  ImGuiWindow *this;
  ImGuiID id;
  long lVar2;
  char *str;
  uint flags;
  ImRect bb;
  ImRect local_28;
  
  this = GImGui->CurrentWindow;
  str = "#SCROLLY";
  if (axis == ImGuiAxis_X) {
    str = "#SCROLLX";
  }
  id = ImGuiWindow::GetIDNoKeepAlive(this,str,(char *)0x0);
  KeepAliveID(id);
  local_28 = GetWindowScrollbarRect(this,axis);
  if (axis == ImGuiAxis_X) {
    flags = (this->ScrollbarY ^ 1) << 7 | 0x140;
    lVar2 = 0;
  }
  else {
    if (axis != ImGuiAxis_Y) {
      __assert_fail("idx <= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                    ,0xfa,"float &ImVec2::operator[](size_t)");
    }
    flags = (this->ScrollbarX ^ 1) * 0x80 + (uint)((this->Flags & 0x401U) == 1) * 0x20 + 0x100;
    lVar2 = 1;
  }
  fVar1 = (&(this->WindowPadding).x)[lVar2];
  ScrollbarEx(&local_28,id,axis,&(this->Scroll).x + lVar2,
              (&(this->InnerRect).Max.x)[lVar2] - (&(this->InnerRect).Min.x)[lVar2],
              fVar1 + fVar1 + (&(this->ContentSize).x)[lVar2],flags);
  return;
}

Assistant:

void ImGui::Scrollbar(ImGuiAxis axis)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const ImGuiID id = GetWindowScrollbarID(window, axis);
    KeepAliveID(id);

    // Calculate scrollbar bounding box
    ImRect bb = GetWindowScrollbarRect(window, axis);
    ImDrawFlags rounding_corners = ImDrawFlags_RoundCornersNone;
    if (axis == ImGuiAxis_X)
    {
        rounding_corners |= ImDrawFlags_RoundCornersBottomLeft;
        if (!window->ScrollbarY)
            rounding_corners |= ImDrawFlags_RoundCornersBottomRight;
    }
    else
    {
        if ((window->Flags & ImGuiWindowFlags_NoTitleBar) && !(window->Flags & ImGuiWindowFlags_MenuBar))
            rounding_corners |= ImDrawFlags_RoundCornersTopRight;
        if (!window->ScrollbarX)
            rounding_corners |= ImDrawFlags_RoundCornersBottomRight;
    }
    float size_avail = window->InnerRect.Max[axis] - window->InnerRect.Min[axis];
    float size_contents = window->ContentSize[axis] + window->WindowPadding[axis] * 2.0f;
    ScrollbarEx(bb, id, axis, &window->Scroll[axis], size_avail, size_contents, rounding_corners);
}